

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PtexReader.cpp
# Opt level: O0

void __thiscall Ptex::v2_4::PtexReader::purge(PtexReader *this)

{
  vector<Ptex::v2_4::FaceInfo,_std::allocator<Ptex::v2_4::FaceInfo>_> *in_RDI;
  PtexReader *in_stack_ffffffffffffff40;
  vector<Ptex::v2_4::FaceInfo,_std::allocator<Ptex::v2_4::FaceInfo>_> *in_stack_ffffffffffffff50;
  PtexReader *in_stack_ffffffffffffff60;
  undefined1 local_98 [24];
  undefined1 local_80 [24];
  undefined1 local_68 [24];
  undefined1 local_50 [24];
  undefined1 local_38 [24];
  undefined1 local_20 [32];
  
  prune(in_stack_ffffffffffffff60);
  if (in_RDI[0xd].super__Vector_base<Ptex::v2_4::FaceInfo,_std::allocator<Ptex::v2_4::FaceInfo>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    in_stack_ffffffffffffff40 =
         (PtexReader *)
         in_RDI[0xd].super__Vector_base<Ptex::v2_4::FaceInfo,_std::allocator<Ptex::v2_4::FaceInfo>_>
         ._M_impl.super__Vector_impl_data._M_start;
    if (in_stack_ffffffffffffff40 != (PtexReader *)0x0) {
      operator_delete__(in_stack_ffffffffffffff40);
    }
    in_RDI[0xd].super__Vector_base<Ptex::v2_4::FaceInfo,_std::allocator<Ptex::v2_4::FaceInfo>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  }
  memset(local_20,0,0x18);
  std::vector<Ptex::v2_4::FaceInfo,_std::allocator<Ptex::v2_4::FaceInfo>_>::vector
            ((vector<Ptex::v2_4::FaceInfo,_std::allocator<Ptex::v2_4::FaceInfo>_> *)0x107dc2);
  std::vector<Ptex::v2_4::FaceInfo,_std::allocator<Ptex::v2_4::FaceInfo>_>::swap
            (in_stack_ffffffffffffff50,in_RDI);
  std::vector<Ptex::v2_4::FaceInfo,_std::allocator<Ptex::v2_4::FaceInfo>_>::~vector
            (in_stack_ffffffffffffff50);
  memset(local_38,0,0x18);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x107e09);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::swap
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_ffffffffffffff50,
             (vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_RDI);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_ffffffffffffff50);
  memset(local_50,0,0x18);
  std::vector<Ptex::v2_4::LevelInfo,_std::allocator<Ptex::v2_4::LevelInfo>_>::vector
            ((vector<Ptex::v2_4::LevelInfo,_std::allocator<Ptex::v2_4::LevelInfo>_> *)0x107e4a);
  std::vector<Ptex::v2_4::LevelInfo,_std::allocator<Ptex::v2_4::LevelInfo>_>::swap
            ((vector<Ptex::v2_4::LevelInfo,_std::allocator<Ptex::v2_4::LevelInfo>_> *)
             in_stack_ffffffffffffff50,
             (vector<Ptex::v2_4::LevelInfo,_std::allocator<Ptex::v2_4::LevelInfo>_> *)in_RDI);
  std::vector<Ptex::v2_4::LevelInfo,_std::allocator<Ptex::v2_4::LevelInfo>_>::~vector
            ((vector<Ptex::v2_4::LevelInfo,_std::allocator<Ptex::v2_4::LevelInfo>_> *)
             in_stack_ffffffffffffff50);
  memset(local_68,0,0x18);
  std::vector<long,_std::allocator<long>_>::vector((vector<long,_std::allocator<long>_> *)0x107e85);
  std::vector<long,_std::allocator<long>_>::swap
            ((vector<long,_std::allocator<long>_> *)in_stack_ffffffffffffff50,
             (vector<long,_std::allocator<long>_> *)in_RDI);
  std::vector<long,_std::allocator<long>_>::~vector
            ((vector<long,_std::allocator<long>_> *)in_stack_ffffffffffffff50);
  memset(local_80,0,0x18);
  std::vector<Ptex::v2_4::PtexReader::Level_*,_std::allocator<Ptex::v2_4::PtexReader::Level_*>_>::
  vector((vector<Ptex::v2_4::PtexReader::Level_*,_std::allocator<Ptex::v2_4::PtexReader::Level_*>_>
          *)0x107ec0);
  std::vector<Ptex::v2_4::PtexReader::Level_*,_std::allocator<Ptex::v2_4::PtexReader::Level_*>_>::
  swap((vector<Ptex::v2_4::PtexReader::Level_*,_std::allocator<Ptex::v2_4::PtexReader::Level_*>_> *)
       in_stack_ffffffffffffff50,
       (vector<Ptex::v2_4::PtexReader::Level_*,_std::allocator<Ptex::v2_4::PtexReader::Level_*>_> *)
       in_RDI);
  std::vector<Ptex::v2_4::PtexReader::Level_*,_std::allocator<Ptex::v2_4::PtexReader::Level_*>_>::
  ~vector((vector<Ptex::v2_4::PtexReader::Level_*,_std::allocator<Ptex::v2_4::PtexReader::Level_*>_>
           *)in_stack_ffffffffffffff50);
  memset(local_98,0,0x18);
  std::vector<Ptex::v2_4::PtexReader::MetaEdit,_std::allocator<Ptex::v2_4::PtexReader::MetaEdit>_>::
  vector((vector<Ptex::v2_4::PtexReader::MetaEdit,_std::allocator<Ptex::v2_4::PtexReader::MetaEdit>_>
          *)0x107efb);
  std::vector<Ptex::v2_4::PtexReader::MetaEdit,_std::allocator<Ptex::v2_4::PtexReader::MetaEdit>_>::
  swap((vector<Ptex::v2_4::PtexReader::MetaEdit,_std::allocator<Ptex::v2_4::PtexReader::MetaEdit>_>
        *)in_stack_ffffffffffffff50,
       (vector<Ptex::v2_4::PtexReader::MetaEdit,_std::allocator<Ptex::v2_4::PtexReader::MetaEdit>_>
        *)in_RDI);
  std::vector<Ptex::v2_4::PtexReader::MetaEdit,_std::allocator<Ptex::v2_4::PtexReader::MetaEdit>_>::
  ~vector((vector<Ptex::v2_4::PtexReader::MetaEdit,_std::allocator<Ptex::v2_4::PtexReader::MetaEdit>_>
           *)in_stack_ffffffffffffff50);
  memset(&stack0xffffffffffffff50,0,0x18);
  std::vector<Ptex::v2_4::PtexReader::FaceEdit,_std::allocator<Ptex::v2_4::PtexReader::FaceEdit>_>::
  vector((vector<Ptex::v2_4::PtexReader::FaceEdit,_std::allocator<Ptex::v2_4::PtexReader::FaceEdit>_>
          *)0x107f36);
  std::vector<Ptex::v2_4::PtexReader::FaceEdit,_std::allocator<Ptex::v2_4::PtexReader::FaceEdit>_>::
  swap((vector<Ptex::v2_4::PtexReader::FaceEdit,_std::allocator<Ptex::v2_4::PtexReader::FaceEdit>_>
        *)in_stack_ffffffffffffff50,
       (vector<Ptex::v2_4::PtexReader::FaceEdit,_std::allocator<Ptex::v2_4::PtexReader::FaceEdit>_>
        *)in_RDI);
  std::vector<Ptex::v2_4::PtexReader::FaceEdit,_std::allocator<Ptex::v2_4::PtexReader::FaceEdit>_>::
  ~vector((vector<Ptex::v2_4::PtexReader::FaceEdit,_std::allocator<Ptex::v2_4::PtexReader::FaceEdit>_>
           *)in_stack_ffffffffffffff50);
  closeFP(in_stack_ffffffffffffff40);
  *(undefined1 *)
   ((long)&in_RDI[3].super__Vector_base<Ptex::v2_4::FaceInfo,_std::allocator<Ptex::v2_4::FaceInfo>_>
           ._M_impl.super__Vector_impl_data._M_finish + 1) = 1;
  *(undefined1 *)
   ((long)&in_RDI[3].super__Vector_base<Ptex::v2_4::FaceInfo,_std::allocator<Ptex::v2_4::FaceInfo>_>
           ._M_impl.super__Vector_impl_data._M_finish + 2) = 1;
  *(undefined1 *)
   ((long)&in_RDI[3].super__Vector_base<Ptex::v2_4::FaceInfo,_std::allocator<Ptex::v2_4::FaceInfo>_>
           ._M_impl.super__Vector_impl_data._M_finish + 3) = 0;
  in_RDI[0x1c].super__Vector_base<Ptex::v2_4::FaceInfo,_std::allocator<Ptex::v2_4::FaceInfo>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x2c8;
  in_RDI[0x1c].super__Vector_base<Ptex::v2_4::FaceInfo,_std::allocator<Ptex::v2_4::FaceInfo>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x2c8;
  return;
}

Assistant:

void PtexReader::purge()
{
    // free all dynamic data
    prune();
    if (_constdata) {delete [] _constdata; _constdata = 0; }
    std::vector<FaceInfo>().swap(_faceinfo);
    std::vector<uint32_t>().swap(_rfaceids);
    std::vector<LevelInfo>().swap(_levelinfo);
    std::vector<FilePos>().swap(_levelpos);
    std::vector<Level*>().swap(_levels);
    std::vector<MetaEdit>().swap(_metaedits);
    std::vector<FaceEdit>().swap(_faceedits);
    closeFP();

    // reset initial state
    _ok = true;
    _needToOpen = true;
    _pendingPurge = false;
    _memUsed = _baseMemUsed = sizeof(*this);
}